

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall QWizardPage::setCommitPage(QWizardPage *this,bool commitPage)

{
  long lVar1;
  QWizardPagePrivate *d;
  QWizardPage *pQVar2;
  long in_FS_OFFSET;
  QWizardPage *local_28;
  int local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  *(bool *)(lVar1 + 0x30d) = commitPage;
  lVar1 = *(long *)(lVar1 + 600);
  if (lVar1 != 0) {
    local_1c = *(int *)(*(long *)(lVar1 + 8) + 0x340);
    local_28 = (QWizardPage *)0x0;
    pQVar2 = QMap<int,_QWizardPage_*>::value
                       ((QMap<int,_QWizardPage_*> *)(*(long *)(lVar1 + 8) + 0x2e0),&local_1c,
                        &local_28);
    if (pQVar2 == this) {
      QWizardPrivate::updateCurrentPage(*(QWizardPrivate **)(lVar1 + 8));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPage::setCommitPage(bool commitPage)
{
    Q_D(QWizardPage);
    d->commit = commitPage;
    QWizard *wizard = this->wizard();
    if (wizard && wizard->currentPage() == this)
        wizard->d_func()->updateCurrentPage();
}